

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

bool tcu::astc::isValidBlock(deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  int blockWidth;
  int blockHeight;
  DecompressResult DVar1;
  Word *local_948;
  bool local_93d;
  undefined1 local_938 [4];
  DecompressResult result;
  Block128 blockData;
  anon_union_2304_2_1776bc36 tmpBuffer;
  bool isLDR;
  bool isSRGB;
  IVec3 blockPixelSize;
  AstcMode mode_local;
  CompressedTexFormat format_local;
  deUint8 *data_local;
  
  blockPixelSize.m_data[1] = mode;
  blockPixelSize.m_data[2] = format;
  getBlockPixelSize((tcu *)(tmpBuffer.sRGB + 0x8fc),format);
  tmpBuffer._2299_1_ = isAstcSRGBFormat(blockPixelSize.m_data[2]);
  local_93d = (bool)tmpBuffer._2299_1_ || blockPixelSize.m_data[1] == 0;
  tmpBuffer._2298_1_ = local_93d;
  anon_unknown_0::Block128::Block128((Block128 *)local_938,data);
  local_948 = blockData.m_words + 1;
  blockWidth = Vector<int,_3>::x((Vector<int,_3> *)(tmpBuffer.sRGB + 0x8fc));
  blockHeight = Vector<int,_3>::y((Vector<int,_3> *)(tmpBuffer.sRGB + 0x8fc));
  DVar1 = anon_unknown_0::decompressBlock
                    (local_948,(Block128 *)local_938,blockWidth,blockHeight,
                     (bool)(tmpBuffer._2299_1_ & 1),(bool)(tmpBuffer._2298_1_ & 1));
  return DVar1 == DECOMPRESS_RESULT_VALID_BLOCK;
}

Assistant:

bool isValidBlock (const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const tcu::IVec3		blockPixelSize	= getBlockPixelSize(format);
	const bool				isSRGB			= isAstcSRGBFormat(format);
	const bool				isLDR			= isSRGB || mode == TexDecompressionParams::ASTCMODE_LDR;

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGB));

	union
	{
		deUint8		sRGB[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
		float		linear[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
	} tmpBuffer;
	const Block128			blockData		(data);
	const DecompressResult	result			= decompressBlock((isSRGB ? (void*)&tmpBuffer.sRGB[0] : (void*)&tmpBuffer.linear[0]),
															  blockData, blockPixelSize.x(), blockPixelSize.y(), isSRGB, isLDR);

	return result == DECOMPRESS_RESULT_VALID_BLOCK;
}